

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O2

void __thiscall
OpenMPReductionClause::setUserDefinedIdentifier(OpenMPReductionClause *this,char *_identifier)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,_identifier,&local_31);
  std::__cxx11::string::operator=((string *)&this->user_defined_identifier,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void setUserDefinedIdentifier(char* _identifier) { user_defined_identifier = std::string(_identifier); }